

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::DoCompactionWork(DBImpl *this,CompactionState *compact)

{
  Logger *pLVar1;
  VersionSet *this_00;
  TableBuilder *this_01;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  SnapshotImpl *this_02;
  SequenceNumber SVar9;
  Iterator *pIVar10;
  undefined4 extraout_var;
  Comparator *pCVar11;
  uint64_t uVar12;
  Output *pOVar13;
  undefined4 extraout_var_00;
  uint64_t uVar14;
  long lVar15;
  FileMetaData *pFVar16;
  size_type sVar17;
  reference pvVar18;
  char *pcVar19;
  CompactionState *in_RDX;
  byte local_1f1;
  undefined1 local_1b4 [8];
  LevelSummaryStorage tmp;
  ulong local_148;
  size_t i_1;
  int i;
  int which;
  CompactionStats stats;
  undefined1 local_118 [24];
  Slice local_100;
  Status local_f0;
  undefined1 local_e8 [24];
  undefined1 local_d0 [31];
  byte local_b1;
  undefined1 local_b0 [7];
  bool drop;
  undefined1 local_a8 [8];
  Slice key;
  uint64_t imm_start;
  SequenceNumber last_sequence_for_key;
  string local_80 [7];
  bool has_current_user_key;
  string current_user_key;
  undefined1 local_60 [8];
  ParsedInternalKey ikey;
  Iterator *input;
  int64_t imm_micros;
  uint64_t start_micros;
  CompactionState *compact_local;
  DBImpl *this_local;
  Status *status;
  
  lVar8 = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
  input = (Iterator *)0x0;
  pLVar1 = (Logger *)compact[1].smallest_snapshot;
  uVar4 = Compaction::num_input_files(in_RDX->compaction,0);
  uVar5 = Compaction::level(in_RDX->compaction);
  uVar6 = Compaction::num_input_files(in_RDX->compaction,1);
  iVar7 = Compaction::level(in_RDX->compaction);
  Log(pLVar1,"Compacting %d@%d + %d@%d files",(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,
      (ulong)(iVar7 + 1));
  this_00 = (VersionSet *)compact[8].outfile;
  iVar7 = Compaction::level(in_RDX->compaction);
  iVar7 = VersionSet::NumLevelFiles(this_00,iVar7);
  if (iVar7 < 1) {
    __assert_fail("versions_->NumLevelFiles(compact->compaction->level()) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x380,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (in_RDX->builder != (TableBuilder *)0x0) {
    __assert_fail("compact->builder == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x381,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (in_RDX->outfile != (WritableFile *)0x0) {
    __assert_fail("compact->outfile == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x382,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  bVar2 = SnapshotList::empty((SnapshotList *)(compact + 7));
  if (bVar2) {
    uVar12 = VersionSet::LastSequence((VersionSet *)compact[8].outfile);
    in_RDX->smallest_snapshot = uVar12;
  }
  else {
    this_02 = SnapshotList::oldest((SnapshotList *)(compact + 7));
    SVar9 = SnapshotImpl::sequence_number(this_02);
    in_RDX->smallest_snapshot = SVar9;
  }
  pIVar10 = VersionSet::MakeInputIterator((VersionSet *)compact[8].outfile,in_RDX->compaction);
  port::Mutex::Unlock((Mutex *)&compact[3].smallest_snapshot);
  (*pIVar10->_vptr_Iterator[3])();
  ikey._31_1_ = 0;
  Status::Status((Status *)this);
  ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)local_60);
  std::__cxx11::string::string(local_80);
  bVar2 = false;
  imm_start = 0xffffffffffffff;
  while( true ) {
    uVar4 = (*pIVar10->_vptr_Iterator[2])();
    local_1f1 = 0;
    if ((uVar4 & 1) != 0) {
      bVar3 = std::atomic<bool>::load((atomic<bool> *)&compact[3].builder,memory_order_acquire);
      local_1f1 = bVar3 ^ 0xff;
    }
    if ((local_1f1 & 1) == 0) break;
    bVar3 = std::atomic<bool>::load((atomic<bool> *)(compact + 5),memory_order_relaxed);
    if (bVar3) {
      key.size_ = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
      port::Mutex::Lock((Mutex *)&compact[3].smallest_snapshot);
      if (compact[4].total_bytes != 0) {
        CompactMemTable((DBImpl *)compact);
        port::CondVar::SignalAll((CondVar *)&compact[3].total_bytes);
      }
      port::Mutex::Unlock((Mutex *)&compact[3].smallest_snapshot);
      lVar15 = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
      input = (Iterator *)((lVar15 - key.size_) + (long)input);
    }
    iVar7 = (*pIVar10->_vptr_Iterator[8])();
    local_a8 = (undefined1  [8])CONCAT44(extraout_var,iVar7);
    bVar3 = Compaction::ShouldStopBefore(in_RDX->compaction,(Slice *)local_a8);
    if ((bVar3) && (in_RDX->builder != (TableBuilder *)0x0)) {
      FinishCompactionOutputFile((DBImpl *)local_b0,compact,(Iterator *)in_RDX);
      Status::operator=((Status *)this,(Status *)local_b0);
      Status::~Status((Status *)local_b0);
      bVar3 = Status::ok((Status *)this);
      if (!bVar3) break;
    }
    local_b1 = 0;
    bVar3 = ParseInternalKey((Slice *)local_a8,(ParsedInternalKey *)local_60);
    if (bVar3) {
      bVar3 = true;
      if (bVar2) {
        pCVar11 = user_comparator((DBImpl *)compact);
        Slice::Slice((Slice *)(local_d0 + 8),(string *)local_80);
        iVar7 = (*pCVar11->_vptr_Comparator[2])(pCVar11,local_60,local_d0 + 8);
        bVar3 = iVar7 != 0;
      }
      if (bVar3) {
        pcVar19 = Slice::data((Slice *)local_60);
        Slice::size((Slice *)local_60);
        std::__cxx11::string::assign((char *)local_80,(ulong)pcVar19);
        bVar2 = true;
        imm_start = 0xffffffffffffff;
      }
      if (in_RDX->smallest_snapshot < imm_start) {
        if ((((int)ikey.sequence == 0) && (ikey.user_key.size_ <= in_RDX->smallest_snapshot)) &&
           (bVar3 = Compaction::IsBaseLevelForKey(in_RDX->compaction,(Slice *)local_60), bVar3)) {
          local_b1 = 1;
        }
      }
      else {
        local_b1 = 1;
      }
      imm_start = ikey.user_key.size_;
    }
    else {
      std::__cxx11::string::clear();
      bVar2 = false;
      imm_start = 0xffffffffffffff;
    }
    if ((local_b1 & 1) == 0) {
      if (in_RDX->builder == (TableBuilder *)0x0) {
        OpenCompactionOutputFile((DBImpl *)local_d0,compact);
        Status::operator=((Status *)this,(Status *)local_d0);
        Status::~Status((Status *)local_d0);
        bVar3 = Status::ok((Status *)this);
        if (!bVar3) break;
      }
      uVar12 = TableBuilder::NumEntries(in_RDX->builder);
      if (uVar12 == 0) {
        pOVar13 = CompactionState::current_output(in_RDX);
        InternalKey::DecodeFrom(&pOVar13->smallest,(Slice *)local_a8);
      }
      pOVar13 = CompactionState::current_output(in_RDX);
      InternalKey::DecodeFrom(&pOVar13->largest,(Slice *)local_a8);
      this_01 = in_RDX->builder;
      iVar7 = (*pIVar10->_vptr_Iterator[9])();
      local_e8._8_8_ = CONCAT44(extraout_var_00,iVar7);
      TableBuilder::Add(this_01,(Slice *)local_a8,(Slice *)(local_e8 + 8));
      uVar12 = TableBuilder::FileSize(in_RDX->builder);
      uVar14 = Compaction::MaxOutputFileSize(in_RDX->compaction);
      if (uVar14 <= uVar12) {
        FinishCompactionOutputFile((DBImpl *)local_e8,compact,(Iterator *)in_RDX);
        Status::operator=((Status *)this,(Status *)local_e8);
        Status::~Status((Status *)local_e8);
        bVar3 = Status::ok((Status *)this);
        if (!bVar3) break;
      }
    }
    (*pIVar10->_vptr_Iterator[6])();
  }
  bVar2 = Status::ok((Status *)this);
  if ((bVar2) &&
     (bVar2 = std::atomic<bool>::load((atomic<bool> *)&compact[3].builder,memory_order_acquire),
     bVar2)) {
    Slice::Slice(&local_100,"Deleting DB during compaction");
    Slice::Slice((Slice *)(local_118 + 8));
    Status::IOError(&local_f0,&local_100,(Slice *)(local_118 + 8));
    Status::operator=((Status *)this,&local_f0);
    Status::~Status(&local_f0);
  }
  bVar2 = Status::ok((Status *)this);
  if ((bVar2) && (in_RDX->builder != (TableBuilder *)0x0)) {
    FinishCompactionOutputFile((DBImpl *)local_118,compact,(Iterator *)in_RDX);
    Status::operator=((Status *)this,(Status *)local_118);
    Status::~Status((Status *)local_118);
  }
  bVar2 = Status::ok((Status *)this);
  if (bVar2) {
    (*pIVar10->_vptr_Iterator[10])(&stats.bytes_written);
    Status::operator=((Status *)this,(Status *)&stats.bytes_written);
    Status::~Status((Status *)&stats.bytes_written);
  }
  if (pIVar10 != (Iterator *)0x0) {
    (*pIVar10->_vptr_Iterator[1])();
  }
  CompactionStats::CompactionStats((CompactionStats *)&i);
  lVar15 = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
  _i = (lVar15 - lVar8) - (long)input;
  for (i_1._4_4_ = 0; i_1._4_4_ < 2; i_1._4_4_ = i_1._4_4_ + 1) {
    for (i_1._0_4_ = 0; iVar7 = Compaction::num_input_files(in_RDX->compaction,i_1._4_4_),
        (int)i_1 < iVar7; i_1._0_4_ = (int)i_1 + 1) {
      pFVar16 = Compaction::input(in_RDX->compaction,i_1._4_4_,(int)i_1);
      stats.micros = pFVar16->file_size + stats.micros;
    }
  }
  for (local_148 = 0;
      sVar17 = std::
               vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
               ::size(&in_RDX->outputs), local_148 < sVar17; local_148 = local_148 + 1) {
    pvVar18 = std::
              vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
              ::operator[](&in_RDX->outputs,local_148);
    stats.bytes_read = pvVar18->file_size + stats.bytes_read;
  }
  port::Mutex::Lock((Mutex *)&compact[3].smallest_snapshot);
  iVar7 = Compaction::level(in_RDX->compaction);
  CompactionStats::Add
            ((CompactionStats *)(&compact[8].total_bytes + (long)(iVar7 + 1) * 3),
             (CompactionStats *)&i);
  bVar2 = Status::ok((Status *)this);
  if (bVar2) {
    InstallCompactionResults((DBImpl *)(tmp.buffer + 0x5c),compact);
    Status::operator=((Status *)this,(Status *)(tmp.buffer + 0x5c));
    Status::~Status((Status *)(tmp.buffer + 0x5c));
  }
  bVar2 = Status::ok((Status *)this);
  if (!bVar2) {
    RecordBackgroundError((DBImpl *)compact,(Status *)this);
  }
  pLVar1 = (Logger *)compact[1].smallest_snapshot;
  pcVar19 = VersionSet::LevelSummary
                      ((VersionSet *)compact[8].outfile,(LevelSummaryStorage *)local_1b4);
  Log(pLVar1,"compacted to: %s",pcVar19);
  ikey._31_1_ = 1;
  std::__cxx11::string::~string(local_80);
  if ((ikey._31_1_ & 1) == 0) {
    Status::~Status((Status *)this);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::DoCompactionWork(CompactionState* compact) {
  const uint64_t start_micros = env_->NowMicros();
  int64_t imm_micros = 0;  // Micros spent doing imm_ compactions

  Log(options_.info_log, "Compacting %d@%d + %d@%d files",
      compact->compaction->num_input_files(0), compact->compaction->level(),
      compact->compaction->num_input_files(1),
      compact->compaction->level() + 1);

  assert(versions_->NumLevelFiles(compact->compaction->level()) > 0);
  assert(compact->builder == nullptr);
  assert(compact->outfile == nullptr);
  if (snapshots_.empty()) {
    compact->smallest_snapshot = versions_->LastSequence();
  } else {
    compact->smallest_snapshot = snapshots_.oldest()->sequence_number();
  }

  Iterator* input = versions_->MakeInputIterator(compact->compaction);

  // Release mutex while we're actually doing the compaction work
  mutex_.Unlock();

  input->SeekToFirst();
  Status status;
  ParsedInternalKey ikey;
  std::string current_user_key;
  bool has_current_user_key = false;
  SequenceNumber last_sequence_for_key = kMaxSequenceNumber;
  while (input->Valid() && !shutting_down_.load(std::memory_order_acquire)) {
    // Prioritize immutable compaction work
    if (has_imm_.load(std::memory_order_relaxed)) {
      const uint64_t imm_start = env_->NowMicros();
      mutex_.Lock();
      if (imm_ != nullptr) {
        CompactMemTable();
        // Wake up MakeRoomForWrite() if necessary.
        background_work_finished_signal_.SignalAll();
      }
      mutex_.Unlock();
      imm_micros += (env_->NowMicros() - imm_start);
    }

    Slice key = input->key();
    if (compact->compaction->ShouldStopBefore(key) &&
        compact->builder != nullptr) {
      status = FinishCompactionOutputFile(compact, input);
      if (!status.ok()) {
        break;
      }
    }

    // Handle key/value, add to state, etc.
    bool drop = false;
    if (!ParseInternalKey(key, &ikey)) {
      // Do not hide error keys
      current_user_key.clear();
      has_current_user_key = false;
      last_sequence_for_key = kMaxSequenceNumber;
    } else {
      if (!has_current_user_key ||
          user_comparator()->Compare(ikey.user_key, Slice(current_user_key)) !=
              0) {
        // First occurrence of this user key
        current_user_key.assign(ikey.user_key.data(), ikey.user_key.size());
        has_current_user_key = true;
        last_sequence_for_key = kMaxSequenceNumber;
      }

      if (last_sequence_for_key <= compact->smallest_snapshot) {
        // Hidden by an newer entry for same user key
        drop = true;  // (A)
      } else if (ikey.type == kTypeDeletion &&
                 ikey.sequence <= compact->smallest_snapshot &&
                 compact->compaction->IsBaseLevelForKey(ikey.user_key)) {
        // For this user key:
        // (1) there is no data in higher levels
        // (2) data in lower levels will have larger sequence numbers
        // (3) data in layers that are being compacted here and have
        //     smaller sequence numbers will be dropped in the next
        //     few iterations of this loop (by rule (A) above).
        // Therefore this deletion marker is obsolete and can be dropped.
        drop = true;
      }

      last_sequence_for_key = ikey.sequence;
    }
#if 0
    Log(options_.info_log,
        "  Compact: %s, seq %d, type: %d %d, drop: %d, is_base: %d, "
        "%d smallest_snapshot: %d",
        ikey.user_key.ToString().c_str(),
        (int)ikey.sequence, ikey.type, kTypeValue, drop,
        compact->compaction->IsBaseLevelForKey(ikey.user_key),
        (int)last_sequence_for_key, (int)compact->smallest_snapshot);
#endif

    if (!drop) {
      // Open output file if necessary
      if (compact->builder == nullptr) {
        status = OpenCompactionOutputFile(compact);
        if (!status.ok()) {
          break;
        }
      }
      if (compact->builder->NumEntries() == 0) {
        compact->current_output()->smallest.DecodeFrom(key);
      }
      compact->current_output()->largest.DecodeFrom(key);
      compact->builder->Add(key, input->value());

      // Close output file if it is big enough
      if (compact->builder->FileSize() >=
          compact->compaction->MaxOutputFileSize()) {
        status = FinishCompactionOutputFile(compact, input);
        if (!status.ok()) {
          break;
        }
      }
    }

    input->Next();
  }

  if (status.ok() && shutting_down_.load(std::memory_order_acquire)) {
    status = Status::IOError("Deleting DB during compaction");
  }
  if (status.ok() && compact->builder != nullptr) {
    status = FinishCompactionOutputFile(compact, input);
  }
  if (status.ok()) {
    status = input->status();
  }
  delete input;
  input = nullptr;

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros - imm_micros;
  for (int which = 0; which < 2; which++) {
    for (int i = 0; i < compact->compaction->num_input_files(which); i++) {
      stats.bytes_read += compact->compaction->input(which, i)->file_size;
    }
  }
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    stats.bytes_written += compact->outputs[i].file_size;
  }

  mutex_.Lock();
  stats_[compact->compaction->level() + 1].Add(stats);

  if (status.ok()) {
    status = InstallCompactionResults(compact);
  }
  if (!status.ok()) {
    RecordBackgroundError(status);
  }
  VersionSet::LevelSummaryStorage tmp;
  Log(options_.info_log, "compacted to: %s", versions_->LevelSummary(&tmp));
  return status;
}